

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cpp
# Opt level: O1

string * __thiscall
pfederc::BiOpExpr::toString_abi_cxx11_(string *__return_storage_ptr__,BiOpExpr *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  TokenType TVar2;
  long lVar3;
  BiOpExpr *pBVar4;
  undefined8 *puVar5;
  long *plVar6;
  long *plVar7;
  size_type *psVar8;
  ulong *puVar9;
  undefined8 uVar10;
  ulong uVar11;
  BiOpExpr *biopexpr;
  Expr *pEVar12;
  string args;
  string local_140;
  string local_120;
  long *local_100;
  ulong local_f8;
  long local_f0;
  long lStack_e8;
  string *local_e0;
  ulong *local_d8;
  long local_d0;
  ulong local_c8;
  undefined4 uStack_c0;
  undefined4 uStack_bc;
  ulong *local_b8;
  ulong local_b0;
  ulong local_a8;
  long lStack_a0;
  BiOpExpr *local_98;
  ulong *local_90;
  long local_88;
  ulong local_80 [2];
  ulong *local_70;
  long local_68;
  ulong local_60 [2];
  ulong *local_50 [2];
  ulong local_40 [2];
  
  TVar2 = this->opType;
  if (TVar2 - 0x2f < 3) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    local_e0 = __return_storage_ptr__;
    if ((ushort)(TVar2 - TOK_OP_BRACKET_OPEN) < 3) {
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
    }
    else {
      local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_140,"Unexpected branch reached","");
      fatal("expr.cpp",0x330,&local_140);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_140._M_dataplus._M_p != &local_140.field_2) {
        operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
      }
    }
    (*((this->lhs)._M_t.super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>.
       _M_t.super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
       super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl)->_vptr_Expr[2])(&local_140);
    std::__cxx11::string::_M_append((char *)local_e0,(ulong)local_140._M_dataplus._M_p);
    paVar1 = &local_140.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_dataplus._M_p != paVar1) {
      operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::push_back((char)local_e0);
    local_140._M_string_length = 0;
    local_140.field_2._M_allocated_capacity =
         local_140.field_2._M_allocated_capacity & 0xffffffffffffff00;
    pEVar12 = (this->rhs)._M_t.
              super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
              super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
              super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl;
    local_140._M_dataplus._M_p = (pointer)paVar1;
    local_98 = this;
    if (pEVar12->type == EXPR_BIOP) {
      do {
        if (pEVar12->_vptr_Expr != (_func_int **)&PTR__BiOpExpr_00128998) {
          __cxa_bad_cast();
        }
        if (*(short *)&pEVar12[1].parent != 0x2e) break;
        (**(code **)(**(long **)&pEVar12[1].type + 0x10))(&local_d8);
        plVar6 = (long *)std::__cxx11::string::insert((ulong)&local_d8,0,'\x01');
        plVar7 = plVar6 + 2;
        if ((long *)*plVar6 == plVar7) {
          local_f0 = *plVar7;
          lStack_e8 = plVar6[3];
          local_100 = &local_f0;
        }
        else {
          local_f0 = *plVar7;
          local_100 = (long *)*plVar6;
        }
        local_f8 = plVar6[1];
        *plVar6 = (long)plVar7;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        plVar6 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&local_100,(ulong)local_140._M_dataplus._M_p);
        psVar8 = (size_type *)(plVar6 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar6 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar8) {
          local_120.field_2._M_allocated_capacity = *psVar8;
          local_120.field_2._8_8_ = plVar6[3];
          local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
        }
        else {
          local_120.field_2._M_allocated_capacity = *psVar8;
          local_120._M_dataplus._M_p = (pointer)*plVar6;
        }
        local_120._M_string_length = plVar6[1];
        *plVar6 = (long)psVar8;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        std::__cxx11::string::operator=((string *)&local_140,(string *)&local_120);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_120._M_dataplus._M_p != &local_120.field_2) {
          operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
        }
        if (local_100 != &local_f0) {
          operator_delete(local_100,local_f0 + 1);
        }
        if (local_d8 != &local_c8) {
          operator_delete(local_d8,local_c8 + 1);
        }
        pEVar12 = (Expr *)pEVar12[1].lexer;
      } while (pEVar12->type == EXPR_BIOP);
    }
    (*pEVar12->_vptr_Expr[2])(&local_100,pEVar12);
    plVar6 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_100,(ulong)local_140._M_dataplus._M_p);
    pBVar4 = local_98;
    paVar1 = &local_120.field_2;
    psVar8 = (size_type *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar8) {
      local_120.field_2._M_allocated_capacity = *psVar8;
      local_120.field_2._8_8_ = plVar6[3];
      local_120._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_120.field_2._M_allocated_capacity = *psVar8;
      local_120._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_120._M_string_length = plVar6[1];
    *plVar6 = (long)psVar8;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_140,(string *)&local_120);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != paVar1) {
      operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
    }
    if (local_100 != &local_f0) {
      operator_delete(local_100,local_f0 + 1);
    }
    std::__cxx11::string::_M_append((char *)local_e0,(ulong)local_140._M_dataplus._M_p);
    if ((ushort)((short)*(undefined4 *)&pBVar4->opType - 0x2fU) < 3) {
      std::__cxx11::string::push_back((char)local_e0);
    }
    else {
      local_120._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_120,"Unexpected branch reached","");
      fatal("expr.cpp",0x34a,&local_120);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_120._M_dataplus._M_p != paVar1) {
        operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_dataplus._M_p == &local_140.field_2) {
      return local_e0;
    }
    operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
    return local_e0;
  }
  if (TVar2 != TOK_OP_NONE) {
    (*this->tokOp->_vptr_Token[2])(local_50,this->tokOp,(this->super_Expr).lexer);
    plVar6 = (long *)std::__cxx11::string::insert((ulong)local_50,0,'\x01');
    puVar9 = (ulong *)(plVar6 + 2);
    if ((ulong *)*plVar6 == puVar9) {
      local_a8 = *puVar9;
      lStack_a0 = plVar6[3];
      local_b8 = &local_a8;
    }
    else {
      local_a8 = *puVar9;
      local_b8 = (ulong *)*plVar6;
    }
    local_b0 = plVar6[1];
    *plVar6 = (long)puVar9;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::_M_replace_aux((ulong)&local_b8,local_b0,0,'\x01');
    puVar9 = (ulong *)(plVar6 + 2);
    if ((ulong *)*plVar6 == puVar9) {
      local_c8 = *puVar9;
      uStack_c0 = (undefined4)plVar6[3];
      uStack_bc = *(undefined4 *)((long)plVar6 + 0x1c);
      local_d8 = &local_c8;
    }
    else {
      local_c8 = *puVar9;
      local_d8 = (ulong *)*plVar6;
    }
    local_d0 = plVar6[1];
    *plVar6 = (long)puVar9;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    (*((this->lhs)._M_t.super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>.
       _M_t.super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
       super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl)->_vptr_Expr[2])(&local_70);
    uVar11 = 0xf;
    if (local_d8 != &local_c8) {
      uVar11 = local_c8;
    }
    if (uVar11 < (ulong)(local_68 + local_d0)) {
      uVar11 = 0xf;
      if (local_70 != local_60) {
        uVar11 = local_60[0];
      }
      if (uVar11 < (ulong)(local_68 + local_d0)) goto LAB_0011a68f;
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,(ulong)local_d8);
    }
    else {
LAB_0011a68f:
      puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_d8,(ulong)local_70);
    }
    local_100 = &local_f0;
    plVar6 = puVar5 + 2;
    if ((long *)*puVar5 == plVar6) {
      local_f0 = *plVar6;
      lStack_e8 = puVar5[3];
    }
    else {
      local_f0 = *plVar6;
      local_100 = (long *)*puVar5;
    }
    local_f8 = puVar5[1];
    *puVar5 = plVar6;
    puVar5[1] = 0;
    *(undefined1 *)plVar6 = 0;
    plVar6 = (long *)std::__cxx11::string::_M_replace_aux((ulong)&local_100,local_f8,0,'\x01');
    paVar1 = &local_120.field_2;
    puVar9 = (ulong *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar9) {
      local_120.field_2._M_allocated_capacity = *puVar9;
      local_120.field_2._8_8_ = plVar6[3];
      local_120._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_120.field_2._M_allocated_capacity = *puVar9;
      local_120._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_120._M_string_length = plVar6[1];
    *plVar6 = (long)puVar9;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    (*((this->rhs)._M_t.super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>.
       _M_t.super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
       super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl)->_vptr_Expr[2])(&local_90);
    uVar10 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != paVar1) {
      uVar10 = local_120.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar10 < local_88 + local_120._M_string_length) {
      uVar11 = 0xf;
      if (local_90 != local_80) {
        uVar11 = local_80[0];
      }
      if (uVar11 < local_88 + local_120._M_string_length) goto LAB_0011a8ff;
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace
                         ((ulong)&local_90,0,(char *)0x0,(ulong)local_120._M_dataplus._M_p);
    }
    else {
LAB_0011a8ff:
      puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_120,(ulong)local_90);
    }
    local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
    psVar8 = puVar5 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar8) {
      local_140.field_2._M_allocated_capacity = *psVar8;
      local_140.field_2._8_8_ = puVar5[3];
    }
    else {
      local_140.field_2._M_allocated_capacity = *psVar8;
      local_140._M_dataplus._M_p = (pointer)*puVar5;
    }
    local_140._M_string_length = puVar5[1];
    *puVar5 = psVar8;
    puVar5[1] = 0;
    *(undefined1 *)psVar8 = 0;
    plVar6 = (long *)std::__cxx11::string::_M_replace_aux
                               ((ulong)&local_140,local_140._M_string_length,0,'\x01');
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar8 = (size_type *)(plVar6 + 2);
    if ((size_type *)*plVar6 == psVar8) {
      lVar3 = plVar6[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar8;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar3;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar6;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar8;
    }
    __return_storage_ptr__->_M_string_length = plVar6[1];
    *plVar6 = (long)psVar8;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_dataplus._M_p != &local_140.field_2) {
      operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
    }
    if (local_90 != local_80) {
      operator_delete(local_90,local_80[0] + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != paVar1) {
      operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
    }
    if (local_100 != &local_f0) {
      operator_delete(local_100,local_f0 + 1);
    }
    if (local_70 != local_60) {
      operator_delete(local_70,local_60[0] + 1);
    }
    if (local_d8 != &local_c8) {
      operator_delete(local_d8,local_c8 + 1);
    }
    if (local_b8 != &local_a8) {
      operator_delete(local_b8,local_a8 + 1);
    }
    if (local_50[0] == local_40) {
      return __return_storage_ptr__;
    }
    goto LAB_0011aa9c;
  }
  (*((this->lhs)._M_t.super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t
     .super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
     super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl)->_vptr_Expr[2])(&local_d8);
  puVar5 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_d8,0,(char *)0x0,0x11fc9d);
  plVar6 = puVar5 + 2;
  if ((long *)*puVar5 == plVar6) {
    local_f0 = *plVar6;
    lStack_e8 = puVar5[3];
    local_100 = &local_f0;
  }
  else {
    local_f0 = *plVar6;
    local_100 = (long *)*puVar5;
  }
  local_f8 = puVar5[1];
  *puVar5 = plVar6;
  puVar5[1] = 0;
  *(undefined1 *)(puVar5 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::_M_replace_aux((ulong)&local_100,local_f8,0,'\x01');
  paVar1 = &local_120.field_2;
  puVar9 = (ulong *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar9) {
    local_120.field_2._M_allocated_capacity = *puVar9;
    local_120.field_2._8_8_ = plVar6[3];
    local_120._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_120.field_2._M_allocated_capacity = *puVar9;
    local_120._M_dataplus._M_p = (pointer)*plVar6;
  }
  local_120._M_string_length = plVar6[1];
  *plVar6 = (long)puVar9;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  (*((this->rhs)._M_t.super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t
     .super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
     super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl)->_vptr_Expr[2])(&local_b8);
  uVar10 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p != paVar1) {
    uVar10 = local_120.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar10 < local_b0 + local_120._M_string_length) {
    uVar11 = 0xf;
    if (local_b8 != &local_a8) {
      uVar11 = local_a8;
    }
    if (uVar11 < local_b0 + local_120._M_string_length) goto LAB_0011a5f2;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace
                       ((ulong)&local_b8,0,(char *)0x0,(ulong)local_120._M_dataplus._M_p);
  }
  else {
LAB_0011a5f2:
    puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_120,(ulong)local_b8);
  }
  local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
  psVar8 = puVar5 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar8) {
    local_140.field_2._M_allocated_capacity = *psVar8;
    local_140.field_2._8_8_ = puVar5[3];
  }
  else {
    local_140.field_2._M_allocated_capacity = *psVar8;
    local_140._M_dataplus._M_p = (pointer)*puVar5;
  }
  local_140._M_string_length = puVar5[1];
  *puVar5 = psVar8;
  puVar5[1] = 0;
  *(undefined1 *)psVar8 = 0;
  plVar6 = (long *)std::__cxx11::string::_M_replace_aux
                             ((ulong)&local_140,local_140._M_string_length,0,'\x01');
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar8 = (size_type *)(plVar6 + 2);
  if ((size_type *)*plVar6 == psVar8) {
    lVar3 = plVar6[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar8;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar3;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar6;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar8;
  }
  __return_storage_ptr__->_M_string_length = plVar6[1];
  *plVar6 = (long)psVar8;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140._M_dataplus._M_p != &local_140.field_2) {
    operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
  }
  if (local_b8 != &local_a8) {
    operator_delete(local_b8,local_a8 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p != paVar1) {
    operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
  }
  if (local_100 != &local_f0) {
    operator_delete(local_100,local_f0 + 1);
  }
  local_40[0] = local_c8;
  local_50[0] = local_d8;
  if (local_d8 == &local_c8) {
    return __return_storage_ptr__;
  }
LAB_0011aa9c:
  operator_delete(local_50[0],local_40[0] + 1);
  return __return_storage_ptr__;
}

Assistant:

std::string BiOpExpr::toString() const noexcept {
  switch (getOperatorType()) {
  case TokenType::TOK_OP_BRACKET_OPEN:
  case TokenType::TOK_OP_ARR_BRACKET_OPEN:
  case TokenType::TOK_OP_TEMPL_BRACKET_OPEN: {
    std::string result;
    switch (getOperatorType()) {
      case TokenType::TOK_OP_BRACKET_OPEN:
        result += '(';
        break;
      case TokenType::TOK_OP_ARR_BRACKET_OPEN:
        result += '[';
        break;
      case TokenType::TOK_OP_TEMPL_BRACKET_OPEN:
        result += '{';
        break;
      default:
        fatal("expr.cpp", __LINE__, "Unexpected branch reached");
        break;
    }
    result += getLeft().toString();
    result += ' ';
    std::string args;
    const Expr * expr = &getRight();
    while (isBiOpExpr(*expr, TokenType::TOK_OP_COMMA)) {
      const BiOpExpr * biopexpr = dynamic_cast<const BiOpExpr*>(expr);
      args = ' ' + biopexpr->getRight().toString() + args;
      expr = &biopexpr->getLeft();
    }

    args = expr->toString() + args;
    result += args;
    switch (getOperatorType()) {
      case TokenType::TOK_OP_BRACKET_OPEN:
        result += ')';
        break;
      case TokenType::TOK_OP_ARR_BRACKET_OPEN:
        result += ']';
        break;
      case TokenType::TOK_OP_TEMPL_BRACKET_OPEN:
        result += '}';
        break;
      default:
        fatal("expr.cpp", __LINE__, "Unexpected branch reached");
        break;
    }

    return result;
  }
  case TokenType::TOK_OP_NONE:
    return "( " + getLeft().toString() + ' ' + getRight().toString() + ')';
  default:
    return '(' + getOperatorToken().toString(getLexer()) + ' ' +
      getLeft().toString() + ' ' + getRight().toString() + ')';
  }
}